

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O1

ValueType ValueType::Verify(ValueType valueType)

{
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  undefined4 *puVar4;
  char *message;
  char *error;
  uint lineNumber;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a [4];
  ValueType valueType_local;
  
  local_1a[0] = valueType.field_0;
  if (valueType.field_0 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x69,"(valueType.bits)","valueType.bits");
    if (!bVar2) goto LAB_00b1fd05;
    *puVar4 = 0;
  }
  if (((ushort)valueType.field_0 & 0x10) == 0) {
    if (((ushort)valueType.field_0 & 0xc0) != 0 &&
        (char)(((ushort)valueType.field_0 & 0x20) >> 5) == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      error = 
      "(valueType.OneOn(Bits::Object) || valueType.OneOn(Bits::Int) || valueType.AnyOnExcept(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged))"
      ;
      message = 
      "valueType.OneOn(Bits::Object) || valueType.OneOn(Bits::Int) || valueType.AnyOnExcept(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged)"
      ;
      lineNumber = 0x6e;
LAB_00b1fc8b:
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,lineNumber,error,message);
      if (!bVar2) goto LAB_00b1fd05;
      *puVar4 = 0;
    }
  }
  else {
    OVar3 = GetObjectType((ValueType *)&local_1a[0].field_0);
    if (CharArray < OVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      error = "(!valueType.OneOn(Bits::Object) || valueType.GetObjectType() < ObjectType::Count)";
      message = "!valueType.OneOn(Bits::Object) || valueType.GetObjectType() < ObjectType::Count";
      lineNumber = 0x6a;
      goto LAB_00b1fc8b;
    }
  }
  if (((ushort)valueType.field_0 & 0xd0) == 0x80) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x71,
                       "(valueType.OneOn(Bits::Object) || !valueType.AllEqual(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged, Bits::IntIsLikelyUntagged))"
                       ,
                       "valueType.OneOn(Bits::Object) || !valueType.AllEqual(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged, Bits::IntIsLikelyUntagged)"
                      );
    if (!bVar2) {
LAB_00b1fd05:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return (ValueType)valueType.field_0;
}

Assistant:

ValueType ValueType::Verify(const ValueType valueType)
{
    Assert(valueType.bits);
    Assert(!valueType.OneOn(Bits::Object) || valueType.GetObjectType() < ObjectType::Count);
    Assert(
        valueType.OneOn(Bits::Object) ||
        valueType.OneOn(Bits::Int) ||
        valueType.AnyOnExcept(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged));
    Assert(
        valueType.OneOn(Bits::Object) ||
        !valueType.AllEqual(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged, Bits::IntIsLikelyUntagged));

    return valueType;
}